

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDeformer.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::BlendShape::BlendShape
          (BlendShape *this,uint64_t id,Element *element,Document *doc,string *name)

{
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *this_00
  ;
  string *this_01;
  bool bVar1;
  uint64_t dest;
  size_type __n;
  reference ppCVar2;
  BlendShapeChannel *local_88;
  BlendShapeChannel *bspc;
  Connection *con;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *__range2;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> local_50
  ;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *local_38;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *conns;
  string *name_local;
  Document *doc_local;
  Element *element_local;
  uint64_t id_local;
  BlendShape *this_local;
  
  conns = (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           *)name;
  name_local = (string *)doc;
  doc_local = (Document *)element;
  element_local = (Element *)id;
  id_local = (uint64_t)this;
  Deformer::Deformer(&this->super_Deformer,id,element,doc,name);
  (this->super_Deformer).super_Object._vptr_Object = (_func_int **)&PTR__BlendShape_0107cca8;
  std::
  vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
  ::vector(&this->blendShapeChannels);
  this_01 = name_local;
  dest = FBX::Object::ID((Object *)this);
  Document::GetConnectionsByDestinationSequenced(&local_50,(Document *)this_01,dest,"Deformer");
  local_38 = &local_50;
  __n = std::
        vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
        size(local_38);
  std::
  vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
  ::reserve(&this->blendShapeChannels,__n);
  this_00 = local_38;
  __end2 = std::
           vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           ::begin(local_38);
  con = (Connection *)
        std::
        vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
        end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
                                     *)&con), bVar1) {
    ppCVar2 = __gnu_cxx::
              __normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
              ::operator*(&__end2);
    bspc = (BlendShapeChannel *)*ppCVar2;
    local_88 = Util::ProcessSimpleConnection<Assimp::FBX::BlendShapeChannel>
                         ((Connection *)bspc,false,"BlendShapeChannel -> BlendShape",
                          (Element *)doc_local,(char **)0x0);
    if (local_88 != (BlendShapeChannel *)0x0) {
      std::
      vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
      ::push_back(&this->blendShapeChannels,&local_88);
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
  ~vector(&local_50);
  return;
}

Assistant:

BlendShape::BlendShape(uint64_t id, const Element& element, const Document& doc, const std::string& name)
    : Deformer(id, element, doc, name)
{
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(), "Deformer");
    blendShapeChannels.reserve(conns.size());
    for (const Connection* con : conns) {
        const BlendShapeChannel* const bspc = ProcessSimpleConnection<BlendShapeChannel>(*con, false, "BlendShapeChannel -> BlendShape", element);
        if (bspc) {
            blendShapeChannels.push_back(bspc);
            continue;
        }
    }
}